

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

RPCHelpMan * echojson(void)

{
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  string *local_40 [2];
  _Alloc_hider local_30;
  undefined8 local_20;
  
  local_20 = *(size_type *)(in_FS_OFFSET + 0x28);
  local_40[0] = (string *)&local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"echojson","");
  echo(in_RDI,local_40[0]);
  if (local_40[0] != (string *)&local_30) {
    operator_delete(local_40[0],(ulong)(local_30._M_p + 1));
  }
  if (*(size_type *)(in_FS_OFFSET + 0x28) == local_20) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan echojson() { return echo("echojson"); }